

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_tokenizer.c
# Opt level: O0

STRING_TOKENIZER_HANDLE STRING_TOKENIZER_create_from_char(char *input)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  char *inputStringToMalloc;
  STRING_TOKEN *result;
  char *input_local;
  
  result = (STRING_TOKEN *)input;
  if (input == (char *)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_tokenizer.c"
                ,"STRING_TOKENIZER_create_from_char",0x2e,1,
                "Invalid Argument. Handle cannot be NULL.");
    }
    inputStringToMalloc = (char *)0x0;
  }
  else {
    inputStringToMalloc = (char *)calloc(1,0x18);
    if (inputStringToMalloc == (char *)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_tokenizer.c"
                  ,"STRING_TOKENIZER_create_from_char",0x34,1,
                  "Memory Allocation failed. Cannot allocate STRING_TOKENIZER.");
      }
    }
    else {
      iVar1 = mallocAndStrcpy_s((char **)&l,(char *)result);
      if (iVar1 == 0) {
        *(LOGGER_LOG *)inputStringToMalloc = l;
        *(undefined8 *)(inputStringToMalloc + 8) = *(undefined8 *)inputStringToMalloc;
        sVar3 = strlen(*(char **)inputStringToMalloc);
        *(size_t *)(inputStringToMalloc + 0x10) = sVar3;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/c-utility/src/string_tokenizer.c"
                    ,"STRING_TOKENIZER_create_from_char",0x38,1,
                    "Memory Allocation Failed. Cannot allocate and copy string Content.");
        }
        free(inputStringToMalloc);
        inputStringToMalloc = (char *)0x0;
      }
    }
  }
  return (STRING_TOKENIZER_HANDLE)inputStringToMalloc;
}

Assistant:

extern STRING_TOKENIZER_HANDLE STRING_TOKENIZER_create_from_char(const char* input)
{
    STRING_TOKEN *result;
    char* inputStringToMalloc;

    /* Codes_SRS_STRING_07_001: [STRING_TOKENIZER_create shall return an NULL STRING_TOKENIZER_HANDLE if parameter input is NULL] */
    if (input == NULL)
    {
        LogError("Invalid Argument. Handle cannot be NULL.");
        result = NULL;
    }
    /* Codes_SRS_STRING_07_002: [STRING_TOKENIZER_create shall allocate a new STRING_TOKENIZER_HANDLE having the content of the STRING_HANDLE copied and current position pointing at the beginning of the string] */
    else if ((result = (STRING_TOKEN*)calloc(1, sizeof(STRING_TOKEN))) == NULL)
    {
        LogError("Memory Allocation failed. Cannot allocate STRING_TOKENIZER.");
    }
    else if ((mallocAndStrcpy_s(&inputStringToMalloc, input)) != 0)
    {
        LogError("Memory Allocation Failed. Cannot allocate and copy string Content.");
        free(result);
        result = NULL;
    }
    else
    {
        result->inputString = inputStringToMalloc;
        result->currentPos = result->inputString; //Current Pos will point to the initial position of Token.
        result->sizeOfinputString = strlen(result->inputString); //Calculate Size of Current String
    }
    return (STRING_TOKENIZER_HANDLE)result;
}